

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O1

bool vkt::api::anon_unknown_0::executeCommandBuffer
               (VkDevice device,DeviceInterface *vk,VkQueue queue,VkCommandBuffer commandBuffer,
               bool exitBeforeEndCommandBuffer)

{
  Handle<(vk::HandleType)10> HVar1;
  VkResult VVar2;
  int iVar3;
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo commandBufferBeginInfo;
  VkCommandBuffer local_e0;
  VkFence local_d8;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_d0;
  VkEvent local_b8;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_b0;
  Move<vk::Handle<(vk::HandleType)10>_> local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  VkCommandBuffer *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_e0 = commandBuffer;
  ::vk::createEvent(&local_98,vk,device,0,(VkAllocationCallbacks *)0x0);
  DStack_b0.m_device._0_4_ =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._0_4_;
  DStack_b0.m_device._4_4_ =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._4_4_;
  DStack_b0.m_allocator._0_4_ =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._0_4_;
  DStack_b0.m_allocator._4_4_ =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._4_4_;
  local_b8.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_b0.m_deviceIface =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0x2a;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  VVar2 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_e0);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(commandBuffer, &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x260);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,local_e0,local_b8.m_internal,0x10000);
  if (!exitBeforeEndCommandBuffer) {
    VVar2 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_e0);
    ::vk::checkResult(VVar2,"vk.endCommandBuffer(commandBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x267);
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_98,vk,device,0,
                      (VkAllocationCallbacks *)0x0);
    HVar1.m_internal =
         local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
    DStack_d0.m_device._0_4_ =
         local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._0_4_;
    DStack_d0.m_device._4_4_ =
         local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._4_4_;
    DStack_d0.m_allocator._0_4_ =
         local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._0_4_;
    DStack_d0.m_allocator._4_4_ =
         local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._4_4_;
    local_d8.m_internal =
         local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
    DStack_d0.m_deviceIface =
         local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
    local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_78 = 0;
    uStack_60 = 0;
    local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_58 = 0;
    local_98.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal = 4;
    uStack_70 = 1;
    local_68 = &local_e0;
    VVar2 = (*vk->_vptr_DeviceInterface[2])(vk,queue,1,&local_98,HVar1.m_internal);
    ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x279);
    VVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_d8,0,0xffffffffffffffff);
    ::vk::checkResult(VVar2,"vk.waitForFences(device, 1u, &fence.get(), 0u, INFINITE_TIMEOUT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x27b);
    if (local_d8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_d0,local_d8);
    }
    iVar3 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,local_b8.m_internal);
    exitBeforeEndCommandBuffer = iVar3 == 3;
  }
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_b0,local_b8);
  }
  return exitBeforeEndCommandBuffer;
}

Assistant:

bool executeCommandBuffer (const VkDevice			device,
						   const DeviceInterface&	vk,
						   const VkQueue			queue,
						   const VkCommandBuffer	commandBuffer,
						   const bool				exitBeforeEndCommandBuffer = false)
{
	const Unique<VkEvent>			event					(createEvent(vk, device));
	const VkCommandBufferBeginInfo	commandBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	//VkStructureType						sType;
		DE_NULL,										//const void*							pNext;
		0u,												//VkCommandBufferUsageFlags				flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL	//const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};

	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &commandBufferBeginInfo));
	{
		const VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;
		vk.cmdSetEvent(commandBuffer, *event, stageMask);
		if (exitBeforeEndCommandBuffer)
			return exitBeforeEndCommandBuffer;
	}
	VK_CHECK(vk.endCommandBuffer(commandBuffer));

	{
		const Unique<VkFence>					fence			(createFence(vk, device));
		const VkSubmitInfo						submitInfo		=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// sType
			DE_NULL,								// pNext
			0u,										// waitSemaphoreCount
			DE_NULL,								// pWaitSemaphores
			(const VkPipelineStageFlags*)DE_NULL,	// pWaitDstStageMask
			1u,										// commandBufferCount
			&commandBuffer,							// pCommandBuffers
			0u,										// signalSemaphoreCount
			DE_NULL									// pSignalSemaphores
		};

		// Submit the command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		// wait for end of execution of queue
		VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), 0u, INFINITE_TIMEOUT));
	}
	// check if buffer has been executed
	const VkResult result = vk.getEventStatus(device, *event);
	return result == VK_EVENT_SET;
}